

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile.cpp
# Opt level: O0

void duckdb::QuantileListOperation<int,false>::
     Finalize<duckdb::list_entry_t,duckdb::QuantileState<int,duckdb::QuantileStandardType>>
               (QuantileState<int,_duckdb::QuantileStandardType> *state,list_entry_t *target,
               AggregateFinalizeData *finalize_data)

{
  bool bVar1;
  int iVar2;
  QuantileBindData *v_t_00;
  Vector *result_00;
  QuantileDirect<int> *this;
  size_type sVar3;
  reference puVar4;
  Interpolator<false> *in_RDX;
  long *in_RSI;
  vector<int,_std::allocator<int>_> *in_RDI;
  Interpolator<false> interp;
  value_type *quantile;
  unsigned_long *q;
  iterator __end3;
  iterator __begin3;
  vector<unsigned_long,_true> *__range3;
  idx_t lower;
  list_entry_t *entry;
  int *v_t;
  int *rdata;
  idx_t ridx;
  Vector *result;
  QuantileBindData *bind_data;
  reference in_stack_ffffffffffffff38;
  FunctionData *in_stack_ffffffffffffff40;
  QuantileValue *q_00;
  Interpolator<false> *in_stack_ffffffffffffff50;
  undefined8 local_98;
  AggregateFinalizeData *in_stack_ffffffffffffff80;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_60;
  vector<unsigned_long,_true> *local_58;
  undefined8 local_50;
  long *local_48;
  int *local_40;
  int *local_38;
  QuantileDirect<int> *accessor;
  
  bVar1 = std::vector<int,_std::allocator<int>_>::empty
                    ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff50);
  if (bVar1) {
    AggregateFinalizeData::ReturnNull(in_stack_ffffffffffffff80);
  }
  else {
    optional_ptr<duckdb::FunctionData,_true>::operator->
              ((optional_ptr<duckdb::FunctionData,_true> *)in_stack_ffffffffffffff40);
    v_t_00 = FunctionData::Cast<duckdb::QuantileBindData>(in_stack_ffffffffffffff40);
    result_00 = (Vector *)duckdb::ListVector::GetEntry(*(Vector **)in_RDX);
    this = (QuantileDirect<int> *)duckdb::ListVector::GetListSize(*(Vector **)in_RDX);
    q_00 = *(QuantileValue **)in_RDX;
    accessor = this;
    sVar3 = std::vector<duckdb::QuantileValue,_std::allocator<duckdb::QuantileValue>_>::size
                      (&(v_t_00->quantiles).
                        super_vector<duckdb::QuantileValue,_std::allocator<duckdb::QuantileValue>_>)
    ;
    duckdb::ListVector::Reserve((Vector *)q_00,(ulong)(this + sVar3));
    local_38 = FlatVector::GetData<int>((Vector *)0xaa7322);
    local_40 = std::vector<int,_std::allocator<int>_>::data
                         ((vector<int,_std::allocator<int>_> *)0xaa7337);
    *in_RSI = (long)accessor;
    local_50 = 0;
    local_58 = &v_t_00->order;
    local_48 = in_RSI;
    local_60._M_current =
         (unsigned_long *)
         std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                   ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                    in_stack_ffffffffffffff38);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffff38);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          *)this,(__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                  *)in_stack_ffffffffffffff38);
      if (!bVar1) break;
      puVar4 = __gnu_cxx::
               __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator*(&local_60);
      in_stack_ffffffffffffff38 =
           vector<duckdb::QuantileValue,_true>::operator[]
                     ((vector<duckdb::QuantileValue,_true> *)this,
                      (size_type)in_stack_ffffffffffffff38);
      std::vector<int,_std::allocator<int>_>::size(in_RDI);
      Interpolator<false>::Interpolator
                (in_stack_ffffffffffffff50,q_00,(idx_t)this,
                 SUB81((ulong)in_stack_ffffffffffffff38 >> 0x38,0));
      iVar2 = Interpolator<false>::Operation<int,int,duckdb::QuantileDirect<int>>
                        (in_RDX,(int *)v_t_00,result_00,accessor);
      local_38[(long)(accessor + *puVar4)] = iVar2;
      local_50 = local_98;
      __gnu_cxx::
      __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator++(&local_60);
    }
    sVar3 = std::vector<duckdb::QuantileValue,_std::allocator<duckdb::QuantileValue>_>::size
                      (&(v_t_00->quantiles).
                        super_vector<duckdb::QuantileValue,_std::allocator<duckdb::QuantileValue>_>)
    ;
    local_48[1] = sVar3;
    duckdb::ListVector::SetListSize(*(Vector **)in_RDX,*local_48 + local_48[1]);
  }
  return;
}

Assistant:

static void Finalize(STATE &state, T &target, AggregateFinalizeData &finalize_data) {
		if (state.v.empty()) {
			finalize_data.ReturnNull();
			return;
		}

		D_ASSERT(finalize_data.input.bind_data);
		auto &bind_data = finalize_data.input.bind_data->Cast<QuantileBindData>();

		auto &result = ListVector::GetEntry(finalize_data.result);
		auto ridx = ListVector::GetListSize(finalize_data.result);
		ListVector::Reserve(finalize_data.result, ridx + bind_data.quantiles.size());
		auto rdata = FlatVector::GetData<CHILD_TYPE>(result);

		auto v_t = state.v.data();
		D_ASSERT(v_t);

		auto &entry = target;
		entry.offset = ridx;
		idx_t lower = 0;
		for (const auto &q : bind_data.order) {
			const auto &quantile = bind_data.quantiles[q];
			Interpolator<DISCRETE> interp(quantile, state.v.size(), bind_data.desc);
			interp.begin = lower;
			rdata[ridx + q] = interp.template Operation<typename STATE::InputType, CHILD_TYPE>(v_t, result);
			lower = interp.FRN;
		}
		entry.length = bind_data.quantiles.size();

		ListVector::SetListSize(finalize_data.result, entry.offset + entry.length);
	}